

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndDisabledOverrideReenable(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
  iVar1 = (pIVar2->ItemFlagsStack).Size;
  (pIVar2->ItemFlagsStack).Size = iVar1 + -1;
  pIVar2->CurrentItemFlags = (pIVar2->ItemFlagsStack).Data[(long)iVar1 + -2];
  (pIVar2->Style).Alpha = pIVar2->DisabledAlphaBackup * (pIVar2->Style).DisabledAlpha;
  return;
}

Assistant:

void ImGui::EndDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    g.DisabledStackSize--;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    g.Style.Alpha = g.DisabledAlphaBackup * g.Style.DisabledAlpha;
}